

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_parse_buffering_period_sei(codec_t *ps_codec,sps_t *ps_sps)

{
  byte bVar1;
  UWORD32 UVar2;
  bitstrm_t *ps_bitstrm_00;
  long in_RSI;
  long in_RDI;
  UWORD32 u4_cpb_cnt;
  hrd_params_t *ps_vui_hdr;
  UWORD32 i;
  buf_period_sei_params_t *ps_buf_period_sei_params;
  vui_t *ps_vui;
  UWORD32 value;
  bitstrm_t *ps_bitstrm;
  parse_ctxt_t *ps_parse;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar3;
  
  ps_bitstrm_00 = (bitstrm_t *)(in_RDI + 0x218);
  *(undefined1 *)(in_RDI + 0x812) = 1;
  UVar2 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *(char *)(in_RDI + 0x820) = (char)UVar2;
  if (*(char *)(in_RSI + 0xaf) == '\0') {
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,1);
    *(char *)(in_RDI + 0x822) = (char)UVar2;
  }
  if (*(char *)(in_RDI + 0x822) == '\0') {
    *(undefined4 *)(in_RDI + 0x824) = 0;
    *(undefined4 *)(in_RDI + 0x828) = 0;
  }
  else {
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc1) + 1);
    *(UWORD32 *)(in_RDI + 0x824) = UVar2;
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc2) + 1);
    *(UWORD32 *)(in_RDI + 0x828) = UVar2;
  }
  UVar2 = ihevcd_bits_get(ps_bitstrm_00,1);
  *(char *)(in_RDI + 0x82c) = (char)UVar2;
  UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc1) + 1);
  *(UWORD32 *)(in_RDI + 0x830) = UVar2;
  if (*(char *)(in_RSI + 0xac) != '\0') {
    bVar1 = *(byte *)(in_RSI + 0xdb);
    for (uVar3 = 0; uVar3 <= bVar1; uVar3 = uVar3 + 1) {
      UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
      *(UWORD32 *)(in_RDI + 0x834 + (ulong)uVar3 * 4) = UVar2;
      UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
      *(UWORD32 *)(in_RDI + 0x934 + (ulong)uVar3 * 4) = UVar2;
      if ((*(char *)(in_RSI + 0xaf) != '\0') || (*(char *)(in_RDI + 0x822) != '\0')) {
        UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
        *(UWORD32 *)(in_RDI + 0x8b4 + (ulong)uVar3 * 4) = UVar2;
        UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
        *(UWORD32 *)(in_RDI + 0x9b4 + (ulong)uVar3 * 4) = UVar2;
      }
    }
  }
  if (*(char *)(in_RSI + 0xad) != '\0') {
    bVar1 = *(byte *)(in_RSI + 0xdb);
    for (uVar3 = 0; uVar3 <= bVar1; uVar3 = uVar3 + 1) {
      UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
      *(UWORD32 *)(in_RDI + 0xa34 + (ulong)uVar3 * 4) = UVar2;
      UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
      *(UWORD32 *)(in_RDI + 0xb34 + (ulong)uVar3 * 4) = UVar2;
      if ((*(char *)(in_RSI + 0xaf) != '\0') || (*(char *)(in_RDI + 0x822) != '\0')) {
        UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
        *(UWORD32 *)(in_RDI + 0xab4 + (ulong)uVar3 * 4) = UVar2;
        UVar2 = ihevcd_bits_get(ps_bitstrm_00,*(byte *)(in_RSI + 0xc0) + 1);
        *(UWORD32 *)(in_RDI + 0xbb4 + (ulong)uVar3 * 4) = UVar2;
      }
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_buffering_period_sei(codec_t *ps_codec,
                                                 sps_t *ps_sps)
{
    parse_ctxt_t *ps_parse = &ps_codec->s_parse;
    bitstrm_t *ps_bitstrm = &ps_parse->s_bitstrm;
    UWORD32 value;
    vui_t *ps_vui;
    buf_period_sei_params_t *ps_buf_period_sei_params;
    UWORD32 i;
    hrd_params_t *ps_vui_hdr;
    UWORD32 u4_cpb_cnt;

    ps_vui = &ps_sps->s_vui_parameters;
    ps_vui_hdr = &ps_vui->s_vui_hrd_parameters;

    ps_buf_period_sei_params = &ps_parse->s_sei_params.s_buf_period_sei_params;

    ps_parse->s_sei_params.i1_buf_period_params_present_flag = 1;

    UEV_PARSE("bp_seq_parameter_set_id", value, ps_bitstrm);
    ps_buf_period_sei_params->u1_bp_seq_parameter_set_id = value;

    if(!ps_vui_hdr->u1_sub_pic_cpb_params_present_flag)
    {
        BITS_PARSE("irap_cpb_params_present_flag", value, ps_bitstrm, 1);
        ps_buf_period_sei_params->u1_rap_cpb_params_present_flag = value;
    }

    if(ps_buf_period_sei_params->u1_rap_cpb_params_present_flag)
    {
        BITS_PARSE("cpb_delay_offset",
                   value,
                   ps_bitstrm,
                   (ps_vui_hdr->u1_au_cpb_removal_delay_length_minus1
                                   + 1));
        ps_buf_period_sei_params->u4_cpb_delay_offset = value;

        BITS_PARSE("dpb_delay_offset",
                   value,
                   ps_bitstrm,
                   (ps_vui_hdr->u1_dpb_output_delay_length_minus1
                                   + 1));
        ps_buf_period_sei_params->u4_dpb_delay_offset = value;
    }
    else
    {
        ps_buf_period_sei_params->u4_cpb_delay_offset = 0;
        ps_buf_period_sei_params->u4_dpb_delay_offset = 0;
    }

    BITS_PARSE("concatenation_flag", value, ps_bitstrm, 1);
    ps_buf_period_sei_params->u1_concatenation_flag = value;

    BITS_PARSE("au_cpb_removal_delay_delta_minus1",
               value,
               ps_bitstrm,
               (ps_vui_hdr->u1_au_cpb_removal_delay_length_minus1
                               + 1));
    ps_buf_period_sei_params->u4_au_cpb_removal_delay_delta_minus1 = value;

    if(ps_vui_hdr->u1_nal_hrd_parameters_present_flag)
    {
        u4_cpb_cnt = ps_vui_hdr->au1_cpb_cnt_minus1[0];

        for(i = 0; i <= u4_cpb_cnt; i++)
        {
            BITS_PARSE("nal_initial_cpb_removal_delay[i]",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_nal_initial_cpb_removal_delay[i] =
                            value;

            BITS_PARSE("nal_initial_cpb_removal_delay_offset",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_nal_initial_cpb_removal_delay_offset[i] =
                            value;

            if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag
                            || ps_buf_period_sei_params->u1_rap_cpb_params_present_flag)
            {
                BITS_PARSE("nal_initial_alt_cpb_removal_delay[i]",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_nal_initial_alt_cpb_removal_delay[i] =
                                value;

                BITS_PARSE("nal_initial_alt_cpb_removal_delay_offset",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_nal_initial_alt_cpb_removal_delay_offset[i] =
                                value;
            }
        }
    }

    if(ps_vui_hdr->u1_vcl_hrd_parameters_present_flag)
    {
        u4_cpb_cnt = ps_vui_hdr->au1_cpb_cnt_minus1[0];

        for(i = 0; i <= u4_cpb_cnt; i++)
        {
            BITS_PARSE("vcl_initial_cpb_removal_delay[i]",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_vcl_initial_cpb_removal_delay[i] =
                            value;

            BITS_PARSE("vcl_initial_cpb_removal_delay_offset",
                       value,
                       ps_bitstrm,
                       (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                       + 1));
            ps_buf_period_sei_params->au4_vcl_initial_cpb_removal_delay_offset[i] =
                            value;

            if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag
                            || ps_buf_period_sei_params->u1_rap_cpb_params_present_flag)
            {
                BITS_PARSE("vcl_initial_alt_cpb_removal_delay[i]",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_vcl_initial_alt_cpb_removal_delay[i] =
                                value;

                BITS_PARSE("vcl_initial_alt_cpb_removal_delay_offset",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_initial_cpb_removal_delay_length_minus1
                                           + 1));
                ps_buf_period_sei_params->au4_vcl_initial_alt_cpb_removal_delay_offset[i] =
                                value;
            }
        }
    }

    return (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
}